

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O3

void llvm::setCurrentDebugTypes(char **Types,uint Count)

{
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this;
  ulong uVar1;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (CurrentDebugType_abi_cxx11_ ==
      (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0) {
    ManagedStaticBase::RegisterManagedStatic
              ((ManagedStaticBase *)&CurrentDebugType_abi_cxx11_,
               object_creator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::call,object_deleter<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::call);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CurrentDebugType_abi_cxx11_,*(pointer *)CurrentDebugType_abi_cxx11_);
  if (Count != 0) {
    uVar1 = 0;
    do {
      if (CurrentDebugType_abi_cxx11_ ==
          (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0) {
        ManagedStaticBase::RegisterManagedStatic
                  ((ManagedStaticBase *)&CurrentDebugType_abi_cxx11_,
                   object_creator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::call,object_deleter<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::call);
      }
      this = CurrentDebugType_abi_cxx11_;
      std::__cxx11::string::string((string *)&local_50,Types[uVar1],&local_51);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      uVar1 = uVar1 + 1;
    } while (Count != uVar1);
  }
  return;
}

Assistant:

void setCurrentDebugTypes(const char **Types, unsigned Count) {
  CurrentDebugType->clear();
  for (size_t T = 0; T < Count; ++T)
    CurrentDebugType->push_back(Types[T]);
}